

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::truncated_normal_dist<float>::pdf(truncated_normal_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  float fVar2;
  
  fVar1 = (this->P).sigma_;
  fVar2 = (x - (this->P).mu_) / fVar1;
  fVar2 = expf(fVar2 * fVar2 * -0.5);
  return (fVar2 * (0.3989423 / fVar1)) / ((this->P).Phi_b - (this->P).Phi_a);
}

Assistant:

pdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return math::constants<result_type>::one_over_sqrt_2pi / P.sigma() *
             math::exp(-x * x / 2) / (P.Phi_b - P.Phi_a);
    }